

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.cc
# Opt level: O0

void load_GL_NV_fence(GLADloadproc load)

{
  code *in_RDI;
  
  if (GLAD_GL_NV_fence != 0) {
    glad_glDeleteFencesNV = (PFNGLDELETEFENCESNVPROC)(*in_RDI)("glDeleteFencesNV");
    glad_glGenFencesNV = (PFNGLGENFENCESNVPROC)(*in_RDI)("glGenFencesNV");
    glad_glIsFenceNV = (PFNGLISFENCENVPROC)(*in_RDI)("glIsFenceNV");
    glad_glTestFenceNV = (PFNGLTESTFENCENVPROC)(*in_RDI)("glTestFenceNV");
    glad_glGetFenceivNV = (PFNGLGETFENCEIVNVPROC)(*in_RDI)("glGetFenceivNV");
    glad_glFinishFenceNV = (PFNGLFINISHFENCENVPROC)(*in_RDI)("glFinishFenceNV");
    glad_glSetFenceNV = (PFNGLSETFENCENVPROC)(*in_RDI)("glSetFenceNV");
  }
  return;
}

Assistant:

static void load_GL_NV_fence(GLADloadproc load) {
	if(!GLAD_GL_NV_fence) return;
	glad_glDeleteFencesNV = (PFNGLDELETEFENCESNVPROC)load("glDeleteFencesNV");
	glad_glGenFencesNV = (PFNGLGENFENCESNVPROC)load("glGenFencesNV");
	glad_glIsFenceNV = (PFNGLISFENCENVPROC)load("glIsFenceNV");
	glad_glTestFenceNV = (PFNGLTESTFENCENVPROC)load("glTestFenceNV");
	glad_glGetFenceivNV = (PFNGLGETFENCEIVNVPROC)load("glGetFenceivNV");
	glad_glFinishFenceNV = (PFNGLFINISHFENCENVPROC)load("glFinishFenceNV");
	glad_glSetFenceNV = (PFNGLSETFENCENVPROC)load("glSetFenceNV");
}